

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynNumber * ParseNumber(ParseContext *ctx)

{
  uint uVar1;
  uint uVar2;
  Lexeme *begin;
  char *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  char *local_38;
  SynNumber *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_number) {
    pcVar3 = begin->pos;
    uVar1 = begin->length;
    ctx->currentLexeme = begin + 1;
    if (begin[1].type == lex_string) {
      local_38 = begin[1].pos;
      uVar2 = begin[1].length;
      ctx->currentLexeme = begin + 2;
      pcVar5 = local_38 + uVar2;
    }
    else {
      local_38 = (char *)0x0;
      pcVar5 = (char *)0x0;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this = (SynNumber *)CONCAT44(extraout_var,iVar4);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    SynBase::SynBase((SynBase *)this,0xf,begin,ctx->currentLexeme + -1);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00247450;
    (this->value).begin = pcVar3;
    (this->value).end = pcVar3 + uVar1;
    (this->suffix).begin = local_38;
    (this->suffix).end = pcVar5;
  }
  else {
    this = (SynNumber *)0x0;
  }
  return this;
}

Assistant:

SynNumber* ParseNumber(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_number))
	{
		InplaceStr value = ctx.Consume();

		InplaceStr suffix;

		if(ctx.At(lex_string))
			suffix = ctx.Consume();

		return new (ctx.get<SynNumber>()) SynNumber(start, ctx.Previous(), value, suffix);
	}

	return NULL;
}